

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpatexpress.cc
# Opt level: O2

PatternBlock * TokenPattern::buildSingle(int4 startbit,int4 endbit,uintm byteval)

{
  uint uVar1;
  PatternBlock *this;
  byte bVar2;
  byte bVar3;
  
  uVar1 = 0;
  if (7 < startbit) {
    uVar1 = startbit;
  }
  bVar2 = (char)startbit - ((byte)uVar1 & 0xf8);
  bVar3 = ((char)startbit - (char)endbit) + 0x1f;
  this = (PatternBlock *)operator_new(0x38);
  PatternBlock::PatternBlock
            (this,uVar1 >> 3,(uint)(-1 << (bVar3 & 0x1f)) >> (bVar2 & 0x1f),
             (byteval << (bVar3 & 0x1f)) >> (bVar2 & 0x1f));
  return this;
}

Assistant:

PatternBlock *TokenPattern::buildSingle(int4 startbit,int4 endbit,uintm byteval)

{				// Create a mask/value pattern within a single word
				// The field is given by the bitrange [startbit,endbit]
				// bit 0 is the MOST sig bit of the word
				// use the least sig bits of byteval to fill in
				// the field's value
  uintm mask;
  int4 offset = 0;
  int4 size = endbit-startbit+1;
  while(startbit >= 8) {
    offset += 1;
    startbit -= 8;
    endbit -= 8;
  }
  mask = (~((uintm)0)) << (sizeof(uintm)*8-size);
  byteval = (byteval << (sizeof(uintm)*8-size))& mask;
  mask >>= startbit;
  byteval >>= startbit;
  return new PatternBlock(offset,mask,byteval);
}